

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldOptions_FeatureSupport::SharedCtor
          (FieldOptions_FeatureSupport *this,Arena *arena)

{
  Arena *arena_local;
  FieldOptions_FeatureSupport *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x10),0,0xc);
  return;
}

Assistant:

inline void FieldOptions_FeatureSupport::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, edition_introduced_),
           0,
           offsetof(Impl_, edition_removed_) -
               offsetof(Impl_, edition_introduced_) +
               sizeof(Impl_::edition_removed_));
}